

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.test.cpp
# Opt level: O0

void __thiscall
CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
CustomType(CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *other)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  iVar1 = idCounter + 1;
  *(int *)(in_RDI + 0x20) = idCounter;
  idCounter = iVar1;
  poVar2 = std::operator<<((ostream *)&std::cout,"CustomType<");
  pcVar3 = std::type_info::name((type_info *)&std::__cxx11::string::typeinfo);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,">::CustomType() id");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x20));
  poVar2 = std::operator<<(poVar2," move ctor, t=");
  poVar2 = std::operator<<(poVar2,in_RDI);
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

CustomType(CustomType&& other) noexcept : t(std::move(other.t)), id(idCounter++) {
        std::cout << "CustomType<" << typeid(T).name() << ">::CustomType() id" << id << " move ctor, t=" << this->t << "\n";
    }